

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemsemaphore_posix.cpp
# Opt level: O2

void __thiscall
QSystemSemaphorePosix::cleanHandle(QSystemSemaphorePosix *this,QSystemSemaphorePrivate *self)

{
  int iVar1;
  int *piVar2;
  char *__name;
  long in_FS_OFFSET;
  QLatin1StringView function;
  QLatin1StringView function_00;
  QArrayDataPointer<char16_t> local_50;
  QArrayDataPointer<char> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((sem_t *)this->semaphore != (sem_t *)0x0) {
    iVar1 = sem_close((sem_t *)this->semaphore);
    if (iVar1 == -1) {
      function.m_data = "QSystemSemaphore::cleanHandle (sem_close)";
      function.m_size = 0x29;
      QSystemSemaphorePrivate::setUnixErrorString(self,function);
    }
    this->semaphore = (sem_t *)0x0;
  }
  if (this->createdSemaphore == true) {
    local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.ptr = &DAT_aaaaaaaaaaaaaaaa;
    local_50.d = (self->nativeKey).key.d.d;
    local_50.ptr = (self->nativeKey).key.d.ptr;
    local_50.size = (self->nativeKey).key.d.size;
    if (local_50.d != (Data *)0x0) {
      LOCK();
      ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::toLocal8Bit((QByteArray *)&local_38,(QString *)&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    __name = local_38.ptr;
    if (local_38.ptr == (char *)0x0) {
      __name = &QByteArray::_empty;
    }
    iVar1 = sem_unlink(__name);
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      if (*piVar2 != 2) {
        function_00.m_data = "QSystemSemaphore::cleanHandle (sem_unlink)";
        function_00.m_size = 0x2a;
        QSystemSemaphorePrivate::setUnixErrorString(self,function_00);
      }
    }
    this->createdSemaphore = false;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSystemSemaphorePosix::cleanHandle(QSystemSemaphorePrivate *self)
{
    if (semaphore != SEM_FAILED) {
        if (::sem_close(semaphore) == -1) {
            self->setUnixErrorString("QSystemSemaphore::cleanHandle (sem_close)"_L1);
#if defined QSYSTEMSEMAPHORE_DEBUG
            qDebug("QSystemSemaphore::cleanHandle sem_close failed.");
#endif
        }
        semaphore = SEM_FAILED;
    }

    if (createdSemaphore) {
        const QByteArray semName = QFile::encodeName(self->nativeKey.nativeKey());
        if (::sem_unlink(semName) == -1 && errno != ENOENT) {
            self->setUnixErrorString("QSystemSemaphore::cleanHandle (sem_unlink)"_L1);
#if defined QSYSTEMSEMAPHORE_DEBUG
            qDebug("QSystemSemaphorePosix::cleanHandle sem_unlink failed.");
#endif
        }
        createdSemaphore = false;
    }
}